

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapimpl.cpp
# Opt level: O1

int32_t uprops_swap(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                   UErrorCode *pErrorCode)

{
  void *__src;
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  void *__dest;
  int32_t dataIndexes [16];
  int local_78 [18];
  
  iVar1 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if (((((*(byte *)((long)inData + 0xc) != 0x55) || (*(char *)((long)inData + 0xd) != 'P')) ||
       (*(char *)((long)inData + 0xe) != 'r')) ||
      ((*(char *)((long)inData + 0xf) != 'o' || (4 < (byte)(*(char *)((long)inData + 0x10) - 3U)))))
     || ((*(char *)((long)inData + 0x10) != '\a' &&
         ((*(char *)((long)inData + 0x12) != '\x05' || (*(char *)((long)inData + 0x13) != '\x02'))))
        )) {
    udata_printError_63(ds,
                        "uprops_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not a Unicode properties file\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  if ((-1 < length) && (length - iVar1 < 0x40)) {
    udata_printError_63(ds,
                        "uprops_swap(): too few bytes (%d after header) for a Unicode properties file\n"
                       );
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0;
  }
  __src = (void *)((long)inData + (long)iVar1);
  lVar6 = 0;
  do {
    iVar2 = udata_readInt32_63(ds,*(int32_t *)((long)__src + lVar6 * 4));
    local_78[lVar6] = iVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  if (-1 < length) {
    uVar5 = 10;
    do {
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      iVar3 = local_78[uVar5];
      if (iVar3 != 0) goto LAB_001e9dff;
    } while (1 < uVar4);
    iVar3 = 0;
LAB_001e9dff:
    uVar4 = length - iVar1;
    if (SBORROW4(uVar4,iVar3 * 4) == (int)(uVar4 + iVar3 * -4) < 0) {
      __dest = (void *)((long)iVar1 + (long)outData);
      if (inData != outData) {
        memcpy(__dest,__src,(long)iVar3 << 2);
      }
      (*ds->swapArray32)(ds,__src,0x40,__dest,pErrorCode);
      utrie_swapAnyVersion_63
                (ds,(void *)((long)__src + 0x40),local_78[0] * 4 + -0x40,
                 (void *)((long)__dest + 0x40),pErrorCode);
      (*ds->swapArray32)(ds,(void *)((long)__src + (long)local_78[0] * 4),
                         (local_78[2] - local_78[0]) * 4,
                         (void *)((long)local_78[0] * 4 + (long)__dest),pErrorCode);
      (*ds->swapArray16)(ds,(void *)((long)__src + (long)local_78[2] * 4),
                         (local_78[3] - local_78[2]) * 4,
                         (void *)((long)local_78[2] * 4 + (long)__dest),pErrorCode);
      utrie_swapAnyVersion_63
                (ds,(void *)((long)local_78[3] * 4 + (long)__src),(local_78[4] - local_78[3]) * 4,
                 (void *)((long)__dest + (long)local_78[3] * 4),pErrorCode);
      (*ds->swapArray32)(ds,(void *)((long)local_78[4] * 4 + (long)__src),
                         (local_78[6] - local_78[4]) * 4,
                         (void *)((long)local_78[4] * 4 + (long)__dest),pErrorCode);
      (*ds->swapArray16)(ds,(void *)((long)__src + (long)local_78[6] * 4),
                         (local_78[7] - local_78[6]) * 4,
                         (void *)((long)local_78[6] * 4 + (long)__dest),pErrorCode);
    }
    else {
      udata_printError_63(ds,
                          "uprops_swap(): too few bytes (%d after header) for a Unicode properties file\n"
                          ,(ulong)uVar4);
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    if ((int)uVar4 < iVar3 * 4) {
      return 0;
    }
  }
  return iVar1 + local_78[7] * 4;
}

Assistant:

static int32_t U_CALLCONV
uprops_swap(const UDataSwapper *ds,
            const void *inData, int32_t length, void *outData,
            UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize, i;

    int32_t dataIndexes[UPROPS_INDEX_COUNT];
    const int32_t *inData32;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x55 &&   /* dataFormat="UPro" */
        pInfo->dataFormat[1]==0x50 &&
        pInfo->dataFormat[2]==0x72 &&
        pInfo->dataFormat[3]==0x6f &&
        (3<=pInfo->formatVersion[0] && pInfo->formatVersion[0]<=7) &&
        (pInfo->formatVersion[0]>=7 ||
            (pInfo->formatVersion[2]==UTRIE_SHIFT &&
             pInfo->formatVersion[3]==UTRIE_INDEX_SHIFT))
    )) {
        udata_printError(ds, "uprops_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not a Unicode properties file\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    /* the properties file must contain at least the indexes array */
    if(length>=0 && (length-headerSize)<(int32_t)sizeof(dataIndexes)) {
        udata_printError(ds, "uprops_swap(): too few bytes (%d after header) for a Unicode properties file\n",
                         length-headerSize);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    /* read the indexes */
    inData32=(const int32_t *)((const char *)inData+headerSize);
    for(i=0; i<UPROPS_INDEX_COUNT; ++i) {
        dataIndexes[i]=udata_readInt32(ds, inData32[i]);
    }

    /*
     * comments are copied from the data format description in genprops/store.c
     * indexes[] constants are in uprops.h
     */
    int32_t dataTop;
    if(length>=0) {
        int32_t *outData32;

        /*
         * In formatVersion 7, UPROPS_DATA_TOP_INDEX has the post-header data size.
         * In earlier formatVersions, it is 0 and a lower dataIndexes entry
         * has the top of the last item.
         */
        for(i=UPROPS_DATA_TOP_INDEX; i>0 && (dataTop=dataIndexes[i])==0; --i) {}

        if((length-headerSize)<(4*dataTop)) {
            udata_printError(ds, "uprops_swap(): too few bytes (%d after header) for a Unicode properties file\n",
                             length-headerSize);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outData32=(int32_t *)((char *)outData+headerSize);

        /* copy everything for inaccessible data (padding) */
        if(inData32!=outData32) {
            uprv_memcpy(outData32, inData32, 4*(size_t)dataTop);
        }

        /* swap the indexes[16] */
        ds->swapArray32(ds, inData32, 4*UPROPS_INDEX_COUNT, outData32, pErrorCode);

        /*
         * swap the main properties UTrie
         * PT serialized properties trie, see utrie.h (byte size: 4*(i0-16))
         */
        utrie_swapAnyVersion(ds,
            inData32+UPROPS_INDEX_COUNT,
            4*(dataIndexes[UPROPS_PROPS32_INDEX]-UPROPS_INDEX_COUNT),
            outData32+UPROPS_INDEX_COUNT,
            pErrorCode);

        /*
         * swap the properties and exceptions words
         * P  const uint32_t props32[i1-i0];
         * E  const uint32_t exceptions[i2-i1];
         */
        ds->swapArray32(ds,
            inData32+dataIndexes[UPROPS_PROPS32_INDEX],
            4*(dataIndexes[UPROPS_EXCEPTIONS_TOP_INDEX]-dataIndexes[UPROPS_PROPS32_INDEX]),
            outData32+dataIndexes[UPROPS_PROPS32_INDEX],
            pErrorCode);

        /*
         * swap the UChars
         * U  const UChar uchars[2*(i3-i2)];
         */
        ds->swapArray16(ds,
            inData32+dataIndexes[UPROPS_EXCEPTIONS_TOP_INDEX],
            4*(dataIndexes[UPROPS_ADDITIONAL_TRIE_INDEX]-dataIndexes[UPROPS_EXCEPTIONS_TOP_INDEX]),
            outData32+dataIndexes[UPROPS_EXCEPTIONS_TOP_INDEX],
            pErrorCode);

        /*
         * swap the additional UTrie
         * i3 additionalTrieIndex; -- 32-bit unit index to the additional trie for more properties
         */
        utrie_swapAnyVersion(ds,
            inData32+dataIndexes[UPROPS_ADDITIONAL_TRIE_INDEX],
            4*(dataIndexes[UPROPS_ADDITIONAL_VECTORS_INDEX]-dataIndexes[UPROPS_ADDITIONAL_TRIE_INDEX]),
            outData32+dataIndexes[UPROPS_ADDITIONAL_TRIE_INDEX],
            pErrorCode);

        /*
         * swap the properties vectors
         * PV const uint32_t propsVectors[(i6-i4)/i5][i5]==uint32_t propsVectors[i6-i4];
         */
        ds->swapArray32(ds,
            inData32+dataIndexes[UPROPS_ADDITIONAL_VECTORS_INDEX],
            4*(dataIndexes[UPROPS_SCRIPT_EXTENSIONS_INDEX]-dataIndexes[UPROPS_ADDITIONAL_VECTORS_INDEX]),
            outData32+dataIndexes[UPROPS_ADDITIONAL_VECTORS_INDEX],
            pErrorCode);

        // swap the Script_Extensions data
        // SCX const uint16_t scriptExtensions[2*(i7-i6)];
        ds->swapArray16(ds,
            inData32+dataIndexes[UPROPS_SCRIPT_EXTENSIONS_INDEX],
            4*(dataIndexes[UPROPS_RESERVED_INDEX_7]-dataIndexes[UPROPS_SCRIPT_EXTENSIONS_INDEX]),
            outData32+dataIndexes[UPROPS_SCRIPT_EXTENSIONS_INDEX],
            pErrorCode);
    }

    /* i7 reservedIndex7; -- 32-bit unit index to the top of the Script_Extensions data */
    return headerSize+4*dataIndexes[UPROPS_RESERVED_INDEX_7];
}